

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImgProcessor.cpp
# Opt level: O0

void __thiscall pobr::imgProcessing::ImgProcessor::loadImg(ImgProcessor *this,string *imgPath)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_78 [96];
  string *local_18;
  string *imgPath_local;
  ImgProcessor *this_local;
  
  local_18 = imgPath;
  imgPath_local = (string *)this;
  cv::imread(local_78,(int)imgPath);
  cv::Mat::operator=(&this->img,(Mat *)local_78);
  cv::Mat::~Mat((Mat *)local_78);
  uVar1 = cv::Mat::empty();
  if ((uVar1 & 1) != 0) {
    std::operator+(&local_c8,"Could not properly load image \"",local_18);
    std::operator+(&local_a8,&local_c8,"\"...");
    pobr::utils::Logger::warning(&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return;
}

Assistant:

const void
ImgProcessor::loadImg(const std::string& imgPath)
{
    this->img = cv::imread(imgPath);

    if (this->img.empty()) {
        Logger::warning("Could not properly load image \"" + imgPath + "\"...");
    }
}